

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench-feed.c
# Opt level: O0

void bench_db_1_semantic(void)

{
  undefined1 local_48 [8];
  bm_results_t res;
  
  bm_init_results();
  bm_run_1((bm_results_t *)local_48,_bm_db_1);
  bm_run_10((bm_results_t *)local_48,_bm_db_1);
  bm_display_results((bm_results_t *)local_48,"/ feed dir -> db parsing (semantic)");
  return;
}

Assistant:

void bench_db_1_semantic(void) {
    bm_results_t res = bm_init_results();

    bm_run_1(&res, _bm_db_1);
    bm_run_10(&res, _bm_db_1);

    bm_display_results(&res, "/ feed dir -> db parsing (semantic)");
}